

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.hpp
# Opt level: O0

int __thiscall diy::io::SharedOutFile::close(SharedOutFile *this,int __fd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ofstream fout_1;
  int x;
  vector<char,_std::allocator<char>_> *cntnts;
  iterator __end4;
  iterator __begin4;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *__range4;
  ofstream fout;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  all_contents;
  vector<char,_std::allocator<char>_> contents;
  __string_type str;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  communicator *in_stack_fffffffffffffae0;
  int *this_00;
  int in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  communicator *in_stack_fffffffffffffaf0;
  allocator_type *__a;
  vector<char,_std::allocator<char>_> *this_01;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb20;
  ostream local_4c0;
  undefined4 local_2a4;
  vector<char,_std::allocator<char>_> *local_2a0;
  vector<char,_std::allocator<char>_> *local_298;
  __normal_iterator<std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
  local_290;
  undefined1 *local_288;
  char local_280 [512];
  undefined1 local_80 [47];
  vector<char,_std::allocator<char>_> local_51;
  allocator_type local_28 [32];
  SharedOutFile *local_8;
  
  local_8 = this;
  if (*(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
               field_0xa8 < 0) {
    local_2a4 = 0;
    iVar2 = mpi::communicator::rank
                      ((communicator *)
                       &(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0x90);
    if (0 < iVar2) {
      in_stack_fffffffffffffaf0 =
           (communicator *)
           &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
            field_0x90;
      mpi::communicator::rank
                ((communicator *)
                 &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x90);
      mpi::communicator::recv<int>
                (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
                 (int *)in_stack_fffffffffffffae0);
    }
    std::ofstream::ofstream
              (&local_4c0,
               (string *)
               &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                field_0x70,_S_app);
    std::__cxx11::ostringstream::str();
    std::operator<<(&local_4c0,(string *)&stack0xfffffffffffffb20);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffb20);
    iVar2 = mpi::communicator::rank
                      ((communicator *)
                       &(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0x90);
    iVar3 = mpi::communicator::size
                      ((communicator *)
                       &(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0x90);
    if (iVar2 < iVar3 + -1) {
      this_00 = (int *)&(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0x90;
      mpi::communicator::rank((communicator *)this_00);
      mpi::communicator::send<int>
                (in_stack_fffffffffffffaf0,iVar2,in_stack_fffffffffffffae8,this_00);
    }
    mpi::communicator::barrier((communicator *)0x111a5a);
    iVar2 = std::ofstream::~ofstream(&local_4c0);
  }
  else {
    __a = local_28;
    std::__cxx11::ostringstream::str();
    local_51.super__Vector_base<char,_std::allocator<char>_>._M_impl._9_8_ =
         std::__cxx11::string::begin();
    local_51.super__Vector_base<char,_std::allocator<char>_>._M_impl._1_8_ =
         std::__cxx11::string::end();
    this_01 = &local_51;
    std::allocator<char>::allocator();
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (this_01,in_stack_fffffffffffffb20,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )this,__a);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    iVar2 = mpi::communicator::rank((communicator *)((long)this + 0x90));
    if (iVar2 == *(int *)((long)this + 0xa8)) {
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                *)0x11170b);
      mpi::gather<char>(in_stack_fffffffffffffaf0,
                        (vector<char,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                        (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
      std::ofstream::ofstream(local_280,(string *)((long)this + 0x70),_S_out);
      local_288 = local_80;
      local_290._M_current =
           (vector<char,_std::allocator<char>_> *)
           std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::begin((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      local_298 = (vector<char,_std::allocator<char>_> *)
                  std::
                  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ::end((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffae0,
                           (__normal_iterator<std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        if (!bVar1) break;
        local_2a0 = __gnu_cxx::
                    __normal_iterator<std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_290);
        pcVar4 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1117cb);
        std::vector<char,_std::allocator<char>_>::size(local_2a0);
        std::ostream::write(local_280,(long)pcVar4);
        __gnu_cxx::
        __normal_iterator<std::vector<char,_std::allocator<char>_>_*,_std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
        ::operator++(&local_290);
      }
      std::ofstream::~ofstream(local_280);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffaf0);
    }
    else {
      mpi::gather<char>(in_stack_fffffffffffffae0,
                        (vector<char,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),0);
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffaf0);
    iVar2 = std::__cxx11::string::~string((string *)local_28);
  }
  return iVar2;
}

Assistant:

void    close()
        {
            if (root_ >= 0)
            {
                auto str = this->str();
                std::vector<char> contents(str.begin(), str.end());
                if (world_.rank() == root_)
                {
                    std::vector<std::vector<char>> all_contents;
                    diy::mpi::gather(world_, contents, all_contents, root_);

                    // write the file serially
                    std::ofstream fout(filename_);
                    for (auto& cntnts : all_contents)
                        fout.write(cntnts.data(), cntnts.size());
                } else
                    diy::mpi::gather(world_, contents, root_);
            } else
            {
                int x = 0;
                if (world_.rank() > 0)
                    world_.recv(world_.rank() - 1, 0, x);

                std::ofstream fout(filename_, std::ios_base::app);
                fout << this->str();

                if (world_.rank() < world_.size() - 1)
                    world_.send(world_.rank() + 1, 0, x);

                world_.barrier();
            }
        }